

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString __thiscall SimpleString::subString(SimpleString *this,size_t beginPos,size_t amount)

{
  size_t sVar1;
  ulong in_RCX;
  ulong in_RDX;
  SimpleString *in_RDI;
  SimpleString *newString;
  SimpleString *this_00;
  
  this_00 = in_RDI;
  sVar1 = size((SimpleString *)0x20af4d);
  if (sVar1 - 1 < in_RDX) {
    SimpleString(this_00,(char *)in_RDI);
  }
  else {
    SimpleString(this_00,(char *)in_RDI);
    sVar1 = size((SimpleString *)0x20af94);
    if (in_RCX < sVar1) {
      in_RDI->buffer_[in_RCX] = '\0';
    }
  }
  return (SimpleString)(char *)this_00;
}

Assistant:

SimpleString SimpleString::subString(size_t beginPos, size_t amount) const
{
    if (beginPos > size()-1) return "";

    SimpleString newString = buffer_ + beginPos;

    if (newString.size() > amount)
        newString.buffer_[amount] = '\0';

    return newString;
}